

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::analysis::TypeManager::GetTypeInstruction(TypeManager *this,Type *type)

{
  undefined8 *puVar1;
  uint32_t uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  float fVar4;
  undefined8 *puVar5;
  long lVar6;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  initializer_list<unsigned_int> init_list_03;
  initializer_list<unsigned_int> init_list_04;
  initializer_list<unsigned_int> init_list_05;
  initializer_list<unsigned_int> init_list_06;
  initializer_list<unsigned_int> init_list_07;
  initializer_list<unsigned_int> init_list_08;
  initializer_list<unsigned_int> init_list_09;
  initializer_list<unsigned_int> init_list_10;
  initializer_list<unsigned_int> init_list_11;
  initializer_list<unsigned_int> init_list_12;
  initializer_list<unsigned_int> init_list_13;
  initializer_list<unsigned_int> init_list_14;
  initializer_list<unsigned_int> init_list_15;
  initializer_list<unsigned_int> init_list_16;
  initializer_list<unsigned_int> init_list_17;
  initializer_list<unsigned_int> init_list_18;
  initializer_list<unsigned_int> init_list_19;
  initializer_list<unsigned_int> init_list_20;
  initializer_list<unsigned_int> init_list_21;
  initializer_list<unsigned_int> init_list_22;
  initializer_list<unsigned_int> init_list_23;
  initializer_list<unsigned_int> init_list_24;
  initializer_list<unsigned_int> init_list_25;
  initializer_list<unsigned_int> init_list_26;
  initializer_list<unsigned_int> init_list_27;
  initializer_list<unsigned_int> init_list_28;
  initializer_list<unsigned_int> init_list_29;
  initializer_list<unsigned_int> init_list_30;
  initializer_list<unsigned_int> init_list_31;
  initializer_list<unsigned_int> init_list_32;
  initializer_list<unsigned_int> init_list_33;
  uint32_t local_35c;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_358;
  Type *local_350;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> ops;
  uint local_318;
  Op local_314;
  SmallVector<unsigned_int,_2UL> local_310;
  SmallVector<unsigned_int,_2UL> local_2e8;
  SmallVector<unsigned_int,_2UL> local_2c0;
  initializer_list<spvtools::opt::Operand> local_298;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_288;
  SmallVector<unsigned_int,_2UL> local_280;
  SmallVector<unsigned_int,_2UL> local_258;
  SmallVector<unsigned_int,_2UL> local_230;
  IRContext *local_208;
  uint local_200;
  uint32_t local_1fc;
  SmallVector<unsigned_int,_2UL> local_1f8;
  uint local_1d0;
  uint local_1cc;
  uint local_1c8;
  uint local_1c4;
  uint local_1c0;
  uint local_1bc;
  undefined1 local_1b8 [8];
  SmallVector<unsigned_int,_2UL> SStack_1b0;
  undefined4 local_188;
  SmallVector<unsigned_int,_2UL> local_180;
  float local_158;
  SmallVector<unsigned_int,_2UL> local_150;
  float local_128;
  SmallVector<unsigned_int,_2UL> local_120;
  float local_f8;
  SmallVector<unsigned_int,_2UL> local_f0;
  float local_c8;
  SmallVector<unsigned_int,_2UL> local_c0;
  undefined4 local_98;
  SmallVector<unsigned_int,_2UL> local_90;
  undefined4 local_68;
  SmallVector<unsigned_int,_2UL> local_60;
  
  uVar2 = GetId(this,type);
  if (uVar2 != 0) {
    return uVar2;
  }
  local_358._M_head_impl = (Instruction *)0x0;
  local_35c = IRContext::TakeNextId(this->context_);
  if (local_35c == 0) {
    return 0;
  }
  RegisterType(this,local_35c,type);
  switch(type->kind_) {
  case kVoid:
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this->context_;
    local_2c0._vptr_SmallVector = (_func_int **)((ulong)local_2c0._vptr_SmallVector._4_4_ << 0x20);
    local_2e8._vptr_SmallVector = (_func_int **)CONCAT44(local_2e8._vptr_SmallVector._4_4_,0x13);
    break;
  case kBool:
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this->context_;
    local_2c0._vptr_SmallVector = (_func_int **)((ulong)local_2c0._vptr_SmallVector._4_4_ << 0x20);
    local_2e8._vptr_SmallVector = (_func_int **)CONCAT44(local_2e8._vptr_SmallVector._4_4_,0x14);
    break;
  case kInteger:
    local_258._vptr_SmallVector = (_func_int **)this->context_;
    local_280._vptr_SmallVector = (_func_int **)CONCAT44(local_280._vptr_SmallVector._4_4_,0x15);
    local_230._vptr_SmallVector = (_func_int **)((ulong)local_230._vptr_SmallVector._4_4_ << 0x20);
    iVar3 = (*type->_vptr_Type[10])(type);
    local_1f8._vptr_SmallVector =
         (_func_int **)
         CONCAT44(local_1f8._vptr_SmallVector._4_4_,
                  *(undefined4 *)(CONCAT44(extraout_var_08,iVar3) + 0x24));
    init_list_15._M_len = 1;
    init_list_15._M_array = (iterator)&local_1f8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_310,init_list_15);
    local_1b8._0_4_ = 6;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&SStack_1b0,&local_310);
    iVar3 = (*type->_vptr_Type[10])(type);
    local_298._M_array =
         (iterator)
         CONCAT44(local_298._M_array._4_4_,(uint)*(byte *)(CONCAT44(extraout_var_09,iVar3) + 0x28));
    init_list_16._M_len = 1;
    init_list_16._M_array = (iterator)&local_298;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&ops,init_list_16);
    local_188 = 6;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              (&local_180,(SmallVector<unsigned_int,_2UL> *)&ops);
    local_2e8._vptr_SmallVector = (_func_int **)local_1b8;
    local_2e8.size_ = 2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_2c0,(IRContext **)&local_258,(Op *)&local_280,(int *)&local_230,
               &local_35c,(initializer_list<spvtools::opt::Operand> *)&local_2e8);
    local_358._M_head_impl = (Instruction *)local_2c0._vptr_SmallVector;
    local_2c0._vptr_SmallVector = (_func_int **)0x0;
    lVar6 = 0x38;
    do {
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)((long)(SStack_1b0.buffer + -6) + lVar6));
      lVar6 = lVar6 + -0x30;
    } while (lVar6 != -0x28);
    goto LAB_00196b91;
  case kFloat:
    local_2c0._vptr_SmallVector = (_func_int **)this->context_;
    local_258._vptr_SmallVector = (_func_int **)CONCAT44(local_258._vptr_SmallVector._4_4_,0x16);
    local_280._vptr_SmallVector = (_func_int **)((ulong)local_280._vptr_SmallVector._4_4_ << 0x20);
    iVar3 = (*type->_vptr_Type[0xc])(type);
    local_230._vptr_SmallVector =
         (_func_int **)
         CONCAT44(local_230._vptr_SmallVector._4_4_,
                  *(undefined4 *)(CONCAT44(extraout_var_10,iVar3) + 0x24));
    init_list_17._M_len = 1;
    init_list_17._M_array = (iterator)&local_230;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_310,init_list_17);
    local_1b8._0_4_ = 6;
    goto LAB_001971d2;
  case kVector:
    iVar3 = (*type->_vptr_Type[0xe])(type);
    uVar2 = GetTypeInstruction(this,*(Type **)(CONCAT44(extraout_var_01,iVar3) + 0x28));
    if (uVar2 == 0) {
      return 0;
    }
    local_258._vptr_SmallVector = (_func_int **)this->context_;
    local_230._vptr_SmallVector = (_func_int **)((ulong)local_230._vptr_SmallVector._4_4_ << 0x20);
    local_280._vptr_SmallVector = (_func_int **)CONCAT44(local_280._vptr_SmallVector._4_4_,0x17);
    local_1f8._vptr_SmallVector = (_func_int **)CONCAT44(local_1f8._vptr_SmallVector._4_4_,uVar2);
    init_list_02._M_len = 1;
    init_list_02._M_array = (iterator)&local_1f8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_310,init_list_02);
    local_1b8._0_4_ = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&SStack_1b0,&local_310);
    iVar3 = (*type->_vptr_Type[0xe])(type);
    local_298._M_array =
         (iterator)
         CONCAT44(local_298._M_array._4_4_,*(undefined4 *)(CONCAT44(extraout_var_02,iVar3) + 0x30));
    init_list_03._M_len = 1;
    init_list_03._M_array = (iterator)&local_298;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&ops,init_list_03);
    local_188 = 6;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              (&local_180,(SmallVector<unsigned_int,_2UL> *)&ops);
    local_2e8._vptr_SmallVector = (_func_int **)local_1b8;
    local_2e8.size_ = 2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_2c0,(IRContext **)&local_258,(Op *)&local_280,(int *)&local_230,
               &local_35c,(initializer_list<spvtools::opt::Operand> *)&local_2e8);
    local_358._M_head_impl = (Instruction *)local_2c0._vptr_SmallVector;
    local_2c0._vptr_SmallVector = (_func_int **)0x0;
    lVar6 = 0x38;
    do {
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)((long)(SStack_1b0.buffer + -6) + lVar6));
      lVar6 = lVar6 + -0x30;
    } while (lVar6 != -0x28);
    goto LAB_00196b91;
  case kMatrix:
    iVar3 = (*type->_vptr_Type[0x10])(type);
    uVar2 = GetTypeInstruction(this,*(Type **)(CONCAT44(extraout_var_13,iVar3) + 0x28));
    if (uVar2 == 0) {
      return 0;
    }
    local_258._vptr_SmallVector = (_func_int **)this->context_;
    local_230._vptr_SmallVector = (_func_int **)((ulong)local_230._vptr_SmallVector._4_4_ << 0x20);
    local_280._vptr_SmallVector = (_func_int **)CONCAT44(local_280._vptr_SmallVector._4_4_,0x18);
    local_1f8._vptr_SmallVector = (_func_int **)CONCAT44(local_1f8._vptr_SmallVector._4_4_,uVar2);
    init_list_20._M_len = 1;
    init_list_20._M_array = (iterator)&local_1f8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_310,init_list_20);
    local_1b8._0_4_ = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&SStack_1b0,&local_310);
    iVar3 = (*type->_vptr_Type[0x10])(type);
    local_298._M_array =
         (iterator)
         CONCAT44(local_298._M_array._4_4_,*(undefined4 *)(CONCAT44(extraout_var_14,iVar3) + 0x30));
    init_list_21._M_len = 1;
    init_list_21._M_array = (iterator)&local_298;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&ops,init_list_21);
    local_188 = 6;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              (&local_180,(SmallVector<unsigned_int,_2UL> *)&ops);
    local_2e8._vptr_SmallVector = (_func_int **)local_1b8;
    local_2e8.size_ = 2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_2c0,(IRContext **)&local_258,(Op *)&local_280,(int *)&local_230,
               &local_35c,(initializer_list<spvtools::opt::Operand> *)&local_2e8);
    local_358._M_head_impl = (Instruction *)local_2c0._vptr_SmallVector;
    local_2c0._vptr_SmallVector = (_func_int **)0x0;
    lVar6 = 0x38;
    do {
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)((long)(SStack_1b0.buffer + -6) + lVar6));
      lVar6 = lVar6 + -0x30;
    } while (lVar6 != -0x28);
    goto LAB_00196b91;
  case kImage:
    iVar3 = (*type->_vptr_Type[0x12])(type);
    lVar6 = CONCAT44(extraout_var_16,iVar3);
    local_1fc = GetTypeInstruction(this,*(Type **)(lVar6 + 0x28));
    if (local_1fc == 0) {
      return 0;
    }
    local_208 = this->context_;
    local_318 = 0;
    local_314 = OpTypeImage;
    init_list_24._M_len = 1;
    init_list_24._M_array = &local_1fc;
    local_350 = type;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_310,init_list_24);
    local_1b8._0_4_ = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&SStack_1b0,&local_310);
    local_200 = *(uint *)(lVar6 + 0x30);
    init_list_25._M_len = 1;
    init_list_25._M_array = &local_200;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&ops,init_list_25);
    local_188 = 0x12;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              (&local_180,(SmallVector<unsigned_int,_2UL> *)&ops);
    local_1bc = *(uint *)(lVar6 + 0x34);
    init_list_26._M_len = 1;
    init_list_26._M_array = &local_1bc;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_2e8,init_list_26);
    fVar4 = 8.40779e-45;
    local_158 = fVar4;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_150,&local_2e8);
    local_1c0 = (uint)*(byte *)(lVar6 + 0x38);
    init_list_27._M_len = 1;
    init_list_27._M_array = &local_1c0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_2c0,init_list_27);
    local_128 = fVar4;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_120,&local_2c0);
    local_1c4 = (uint)*(byte *)(lVar6 + 0x39);
    init_list_28._M_len = 1;
    init_list_28._M_array = &local_1c4;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_258,init_list_28);
    local_f8 = fVar4;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_f0,&local_258);
    local_1c8 = *(uint *)(lVar6 + 0x3c);
    init_list_29._M_len = 1;
    init_list_29._M_array = &local_1c8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_280,init_list_29);
    local_c8 = fVar4;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c0,&local_280);
    local_1cc = *(uint *)(lVar6 + 0x40);
    init_list_30._M_len = 1;
    init_list_30._M_array = &local_1cc;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_230,init_list_30);
    local_98 = 0x15;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_90,&local_230);
    local_1d0 = *(uint *)(lVar6 + 0x44);
    init_list_31._M_len = 1;
    init_list_31._M_array = &local_1d0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1f8,init_list_31);
    local_68 = 0x1a;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_60,&local_1f8);
    local_298._M_array = (iterator)local_1b8;
    local_298._M_len = 8;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_288,&local_208,&local_314,(int *)&local_318,&local_35c,&local_298)
    ;
    local_358._M_head_impl = local_288._M_head_impl;
    local_288._M_head_impl = (Instruction *)0x0;
    lVar6 = 0x158;
    do {
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)((long)(SStack_1b0.buffer + -6) + lVar6));
      lVar6 = lVar6 + -0x30;
    } while (lVar6 != -0x28);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1f8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_230);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_280);
    goto LAB_00196fb4;
  case kSampler:
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this->context_;
    local_2c0._vptr_SmallVector = (_func_int **)((ulong)local_2c0._vptr_SmallVector._4_4_ << 0x20);
    local_2e8._vptr_SmallVector = (_func_int **)CONCAT44(local_2e8._vptr_SmallVector._4_4_,0x1a);
    break;
  case kSampledImage:
    iVar3 = (*type->_vptr_Type[0x16])(type);
    uVar2 = GetTypeInstruction(this,*(Type **)(CONCAT44(extraout_var_18,iVar3) + 0x28));
    if (uVar2 == 0) {
      return 0;
    }
    local_2c0._vptr_SmallVector = (_func_int **)this->context_;
    local_258._vptr_SmallVector = (_func_int **)CONCAT44(local_258._vptr_SmallVector._4_4_,0x1b);
    goto LAB_001970b2;
  case kArray:
    iVar3 = (*type->_vptr_Type[0x18])(type);
    uVar2 = GetTypeInstruction(this,*(Type **)(CONCAT44(extraout_var_04,iVar3) + 0x28));
    if (uVar2 == 0) {
      return 0;
    }
    local_258._vptr_SmallVector = (_func_int **)this->context_;
    local_230._vptr_SmallVector = (_func_int **)((ulong)local_230._vptr_SmallVector._4_4_ << 0x20);
    local_280._vptr_SmallVector = (_func_int **)CONCAT44(local_280._vptr_SmallVector._4_4_,0x1c);
    local_1f8._vptr_SmallVector = (_func_int **)CONCAT44(local_1f8._vptr_SmallVector._4_4_,uVar2);
    init_list_04._M_len = 1;
    init_list_04._M_array = (iterator)&local_1f8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_310,init_list_04);
    local_1b8._0_4_ = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&SStack_1b0,&local_310);
    iVar3 = (*type->_vptr_Type[0x18])(type);
    local_298._M_array =
         (iterator)
         CONCAT44(local_298._M_array._4_4_,*(undefined4 *)(CONCAT44(extraout_var_05,iVar3) + 0x30));
    init_list_05._M_len = 1;
    init_list_05._M_array = (iterator)&local_298;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&ops,init_list_05);
    local_188 = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              (&local_180,(SmallVector<unsigned_int,_2UL> *)&ops);
    local_2e8._vptr_SmallVector = (_func_int **)local_1b8;
    local_2e8.size_ = 2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_2c0,(IRContext **)&local_258,(Op *)&local_280,(int *)&local_230,
               &local_35c,(initializer_list<spvtools::opt::Operand> *)&local_2e8);
    local_358._M_head_impl = (Instruction *)local_2c0._vptr_SmallVector;
    local_2c0._vptr_SmallVector = (_func_int **)0x0;
    lVar6 = 0x38;
    do {
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)((long)(SStack_1b0.buffer + -6) + lVar6));
      lVar6 = lVar6 + -0x30;
    } while (lVar6 != -0x28);
LAB_00196b91:
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)&ops);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_310);
    goto LAB_0019732a;
  case kRuntimeArray:
    iVar3 = (*type->_vptr_Type[0x1a])(type);
    uVar2 = GetTypeInstruction(this,*(Type **)(CONCAT44(extraout_var_17,iVar3) + 0x28));
    if (uVar2 == 0) {
      return 0;
    }
    local_2c0._vptr_SmallVector = (_func_int **)this->context_;
    local_258._vptr_SmallVector = (_func_int **)CONCAT44(local_258._vptr_SmallVector._4_4_,0x1d);
LAB_001970b2:
    local_280._vptr_SmallVector = (_func_int **)((ulong)local_280._vptr_SmallVector._4_4_ << 0x20);
    local_230._vptr_SmallVector = (_func_int **)CONCAT44(local_230._vptr_SmallVector._4_4_,uVar2);
    init_list_32._M_len = 1;
    init_list_32._M_array = (iterator)&local_230;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_310,init_list_32);
    local_1b8._0_4_ = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&SStack_1b0,&local_310);
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_1b8;
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x1;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_2e8,(IRContext **)&local_2c0,(Op *)&local_258,(int *)&local_280,
               &local_35c,(initializer_list<spvtools::opt::Operand> *)&ops);
    local_358._M_head_impl = (Instruction *)local_2e8._vptr_SmallVector;
    local_2e8._vptr_SmallVector = (_func_int **)0x0;
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&SStack_1b0);
    goto LAB_00197236;
  case kStruct:
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_350 = type;
    iVar3 = (*type->_vptr_Type[0x1c])(type);
    puVar1 = *(undefined8 **)(CONCAT44(extraout_var_00,iVar3) + 0x30);
    for (puVar5 = *(undefined8 **)(CONCAT44(extraout_var_00,iVar3) + 0x28); puVar5 != puVar1;
        puVar5 = puVar5 + 1) {
      uVar2 = GetTypeInstruction(this,(Type *)*puVar5);
      if (uVar2 == 0) goto LAB_0019600d;
      local_2e8._vptr_SmallVector = (_func_int **)CONCAT44(local_2e8._vptr_SmallVector._4_4_,uVar2);
      init_list_01._M_len = 1;
      init_list_01._M_array = (iterator)&local_2e8;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_310,init_list_01);
      local_1b8._0_4_ = 1;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&SStack_1b0,&local_310);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>(&ops,(Operand *)local_1b8);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&SStack_1b0);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_310);
    }
    local_310._vptr_SmallVector = (_func_int **)this->context_;
    local_2e8._vptr_SmallVector = (_func_int **)CONCAT44(local_2e8._vptr_SmallVector._4_4_,0x1e);
    goto LAB_001972ed;
  case kOpaque:
    iVar3 = (*type->_vptr_Type[0x1e])(type);
    utils::MakeVector((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ops,
                      (string *)(CONCAT44(extraout_var_03,iVar3) + 0x28));
    local_258._vptr_SmallVector = (_func_int **)this->context_;
    local_280._vptr_SmallVector = (_func_int **)CONCAT44(local_280._vptr_SmallVector._4_4_,0x1f);
    local_230._vptr_SmallVector = (_func_int **)((ulong)local_230._vptr_SmallVector._4_4_ << 0x20);
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              (&local_310,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ops);
    local_1b8._0_4_ = 0xb;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&SStack_1b0,&local_310);
    local_2e8._vptr_SmallVector = (_func_int **)local_1b8;
    local_2e8.size_ = 1;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_2c0,(IRContext **)&local_258,(Op *)&local_280,(int *)&local_230,
               &local_35c,(initializer_list<spvtools::opt::Operand> *)&local_2e8);
    local_358._M_head_impl = (Instruction *)local_2c0._vptr_SmallVector;
    local_2c0._vptr_SmallVector = (_func_int **)0x0;
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&SStack_1b0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_310);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&ops);
    goto LAB_0019732a;
  case kPointer:
    iVar3 = (*type->_vptr_Type[0x20])(type);
    uVar2 = GetTypeInstruction(this,*(Type **)(CONCAT44(extraout_var_15,iVar3) + 0x28));
    if (uVar2 == 0) {
      return 0;
    }
    local_258._vptr_SmallVector = (_func_int **)this->context_;
    local_230._vptr_SmallVector = (_func_int **)((ulong)local_230._vptr_SmallVector._4_4_ << 0x20);
    local_280._vptr_SmallVector = (_func_int **)CONCAT44(local_280._vptr_SmallVector._4_4_,0x20);
    local_1f8._vptr_SmallVector =
         (_func_int **)
         CONCAT44(local_1f8._vptr_SmallVector._4_4_,
                  *(undefined4 *)(CONCAT44(extraout_var_15,iVar3) + 0x30));
    init_list_22._M_len = 1;
    init_list_22._M_array = (iterator)&local_1f8;
    local_350 = type;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_310,init_list_22);
    local_1b8._0_4_ = 0x11;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&SStack_1b0,&local_310);
    local_298._M_array = (iterator)CONCAT44(local_298._M_array._4_4_,uVar2);
    init_list_23._M_len = 1;
    init_list_23._M_array = (iterator)&local_298;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&ops,init_list_23);
    local_188 = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              (&local_180,(SmallVector<unsigned_int,_2UL> *)&ops);
    local_2e8._vptr_SmallVector = (_func_int **)local_1b8;
    local_2e8.size_ = 2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_2c0,(IRContext **)&local_258,(Op *)&local_280,(int *)&local_230,
               &local_35c,(initializer_list<spvtools::opt::Operand> *)&local_2e8);
    local_358._M_head_impl = (Instruction *)local_2c0._vptr_SmallVector;
    local_2c0._vptr_SmallVector = (_func_int **)0x0;
    lVar6 = 0x38;
    do {
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)((long)(SStack_1b0.buffer + -6) + lVar6));
      lVar6 = lVar6 + -0x30;
    } while (lVar6 != -0x28);
    goto LAB_00196fdb;
  case kFunction:
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_350 = type;
    iVar3 = (*type->_vptr_Type[0x22])(type);
    lVar6 = CONCAT44(extraout_var,iVar3);
    uVar2 = GetTypeInstruction(this,*(Type **)(lVar6 + 0x28));
    if (uVar2 == 0) {
LAB_0019600d:
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&ops);
      return 0;
    }
    local_2e8._vptr_SmallVector = (_func_int **)CONCAT44(local_2e8._vptr_SmallVector._4_4_,uVar2);
    init_list._M_len = 1;
    init_list._M_array = (iterator)&local_2e8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_310,init_list);
    local_1b8._0_4_ = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&SStack_1b0,&local_310);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&ops,(Operand *)local_1b8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&SStack_1b0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_310);
    puVar1 = *(undefined8 **)(lVar6 + 0x38);
    for (puVar5 = *(undefined8 **)(lVar6 + 0x30); puVar5 != puVar1; puVar5 = puVar5 + 1) {
      uVar2 = GetTypeInstruction(this,(Type *)*puVar5);
      if (uVar2 == 0) goto LAB_0019600d;
      local_2e8._vptr_SmallVector = (_func_int **)CONCAT44(local_2e8._vptr_SmallVector._4_4_,uVar2);
      init_list_00._M_len = 1;
      init_list_00._M_array = (iterator)&local_2e8;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_310,init_list_00);
      local_1b8._0_4_ = 1;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&SStack_1b0,&local_310);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>(&ops,(Operand *)local_1b8);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&SStack_1b0);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_310);
    }
    local_310._vptr_SmallVector = (_func_int **)this->context_;
    local_2e8._vptr_SmallVector = (_func_int **)CONCAT44(local_2e8._vptr_SmallVector._4_4_,0x21);
LAB_001972ed:
    local_2c0._vptr_SmallVector = (_func_int **)((ulong)local_2c0._vptr_SmallVector._4_4_ << 0x20);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>&>
              ((spvtools *)local_1b8,(IRContext **)&local_310,(Op *)&local_2e8,(int *)&local_2c0,
               &local_35c,&ops);
    local_358._M_head_impl = (Instruction *)local_1b8;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&ops);
    type = local_350;
    goto LAB_0019732a;
  case kEvent:
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this->context_;
    local_2c0._vptr_SmallVector = (_func_int **)((ulong)local_2c0._vptr_SmallVector._4_4_ << 0x20);
    local_2e8._vptr_SmallVector = (_func_int **)CONCAT44(local_2e8._vptr_SmallVector._4_4_,0x22);
    break;
  case kDeviceEvent:
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this->context_;
    local_2c0._vptr_SmallVector = (_func_int **)((ulong)local_2c0._vptr_SmallVector._4_4_ << 0x20);
    local_2e8._vptr_SmallVector = (_func_int **)CONCAT44(local_2e8._vptr_SmallVector._4_4_,0x23);
    break;
  case kReserveId:
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this->context_;
    local_2c0._vptr_SmallVector = (_func_int **)((ulong)local_2c0._vptr_SmallVector._4_4_ << 0x20);
    local_2e8._vptr_SmallVector = (_func_int **)CONCAT44(local_2e8._vptr_SmallVector._4_4_,0x24);
    break;
  case kQueue:
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this->context_;
    local_2c0._vptr_SmallVector = (_func_int **)((ulong)local_2c0._vptr_SmallVector._4_4_ << 0x20);
    local_2e8._vptr_SmallVector = (_func_int **)CONCAT44(local_2e8._vptr_SmallVector._4_4_,0x25);
    break;
  case kPipe:
    local_2c0._vptr_SmallVector = (_func_int **)this->context_;
    local_258._vptr_SmallVector = (_func_int **)CONCAT44(local_258._vptr_SmallVector._4_4_,0x26);
    local_280._vptr_SmallVector = (_func_int **)((ulong)local_280._vptr_SmallVector._4_4_ << 0x20);
    iVar3 = (*type->_vptr_Type[0x2c])(type);
    local_230._vptr_SmallVector =
         (_func_int **)
         CONCAT44(local_230._vptr_SmallVector._4_4_,
                  *(undefined4 *)(CONCAT44(extraout_var_19,iVar3) + 0x24));
    init_list_33._M_len = 1;
    init_list_33._M_array = (iterator)&local_230;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_310,init_list_33);
    local_1b8._0_4_ = 0x1a;
LAB_001971d2:
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&SStack_1b0,&local_310);
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_1b8;
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x1;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_2e8,(IRContext **)&local_2c0,(Op *)&local_258,(int *)&local_280,
               &local_35c,(initializer_list<spvtools::opt::Operand> *)&ops);
    local_358._M_head_impl = (Instruction *)local_2e8._vptr_SmallVector;
    local_2e8._vptr_SmallVector = (_func_int **)0x0;
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&SStack_1b0);
LAB_00197236:
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_310);
    goto LAB_0019732a;
  case kForwardPointer:
    local_258._vptr_SmallVector = (_func_int **)this->context_;
    local_280._vptr_SmallVector = (_func_int **)CONCAT44(local_280._vptr_SmallVector._4_4_,0x27);
    local_230._vptr_SmallVector = (_func_int **)((ulong)local_230._vptr_SmallVector._4_4_ << 0x20);
    local_1f8._vptr_SmallVector =
         (_func_int **)((ulong)local_1f8._vptr_SmallVector & 0xffffffff00000000);
    iVar3 = (*type->_vptr_Type[0x2e])(type);
    local_298._M_array =
         (iterator)
         CONCAT44(local_298._M_array._4_4_,*(undefined4 *)(CONCAT44(extraout_var_11,iVar3) + 0x24));
    init_list_18._M_len = 1;
    init_list_18._M_array = (iterator)&local_298;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_310,init_list_18);
    local_1b8._0_4_ = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&SStack_1b0,&local_310);
    iVar3 = (*type->_vptr_Type[0x2e])(type);
    local_288._M_head_impl._0_4_ = *(undefined4 *)(CONCAT44(extraout_var_12,iVar3) + 0x28);
    init_list_19._M_len = 1;
    init_list_19._M_array = (iterator)&local_288;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&ops,init_list_19);
    local_188 = 0x11;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              (&local_180,(SmallVector<unsigned_int,_2UL> *)&ops);
    local_2e8._vptr_SmallVector = (_func_int **)local_1b8;
    local_2e8.size_ = 2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_2c0,(IRContext **)&local_258,(Op *)&local_280,(int *)&local_230,
               (int *)&local_1f8,(initializer_list<spvtools::opt::Operand> *)&local_2e8);
    local_358._M_head_impl = (Instruction *)local_2c0._vptr_SmallVector;
    local_2c0._vptr_SmallVector = (_func_int **)0x0;
    lVar6 = 0x38;
    do {
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)((long)(SStack_1b0.buffer + -6) + lVar6));
      lVar6 = lVar6 + -0x30;
    } while (lVar6 != -0x28);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)&ops);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_310);
    goto LAB_0019732a;
  case kPipeStorage:
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this->context_;
    local_2c0._vptr_SmallVector = (_func_int **)((ulong)local_2c0._vptr_SmallVector._4_4_ << 0x20);
    local_2e8._vptr_SmallVector = (_func_int **)CONCAT44(local_2e8._vptr_SmallVector._4_4_,0x142);
    break;
  case kNamedBarrier:
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this->context_;
    local_2c0._vptr_SmallVector = (_func_int **)((ulong)local_2c0._vptr_SmallVector._4_4_ << 0x20);
    local_2e8._vptr_SmallVector = (_func_int **)CONCAT44(local_2e8._vptr_SmallVector._4_4_,0x147);
    break;
  case kAccelerationStructureNV:
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this->context_;
    local_2c0._vptr_SmallVector = (_func_int **)((ulong)local_2c0._vptr_SmallVector._4_4_ << 0x20);
    local_2e8._vptr_SmallVector = (_func_int **)CONCAT44(local_2e8._vptr_SmallVector._4_4_,0x14dd);
    break;
  case kCooperativeMatrixNV:
    iVar3 = (*type->_vptr_Type[0x36])(type);
    lVar6 = CONCAT44(extraout_var_07,iVar3);
    local_288._M_head_impl._0_4_ = GetTypeInstruction(this,*(Type **)(lVar6 + 0x28));
    if ((uint32_t)local_288._M_head_impl == 0) {
      return 0;
    }
    local_230._vptr_SmallVector = (_func_int **)this->context_;
    local_298._M_array = (iterator)((ulong)local_298._M_array._4_4_ << 0x20);
    local_1f8._vptr_SmallVector = (_func_int **)CONCAT44(local_1f8._vptr_SmallVector._4_4_,0x14ee);
    init_list_11._M_len = 1;
    init_list_11._M_array = (iterator)&local_288;
    local_350 = type;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_310,init_list_11);
    local_1b8._0_4_ = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&SStack_1b0,&local_310);
    local_208 = (IRContext *)CONCAT44(local_208._4_4_,*(undefined4 *)(lVar6 + 0x30));
    init_list_12._M_len = 1;
    init_list_12._M_array = (iterator)&local_208;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&ops,init_list_12);
    local_188 = 5;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              (&local_180,(SmallVector<unsigned_int,_2UL> *)&ops);
    local_314 = *(Op *)(lVar6 + 0x34);
    init_list_13._M_len = 1;
    init_list_13._M_array = &local_314;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_2e8,init_list_13);
    local_158 = 1.4013e-45;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_150,&local_2e8);
    local_318 = *(uint *)(lVar6 + 0x38);
    init_list_14._M_len = 1;
    init_list_14._M_array = &local_318;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_2c0,init_list_14);
    local_128 = 1.4013e-45;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_120,&local_2c0);
    local_258._vptr_SmallVector = (_func_int **)local_1b8;
    local_258.size_ = 4;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_280,(IRContext **)&local_230,(Op *)&local_1f8,(int *)&local_298,
               &local_35c,(initializer_list<spvtools::opt::Operand> *)&local_258);
    local_358._M_head_impl = (Instruction *)local_280._vptr_SmallVector;
    local_280._vptr_SmallVector = (_func_int **)0x0;
    lVar6 = 0x98;
    do {
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)((long)(SStack_1b0.buffer + -6) + lVar6));
      lVar6 = lVar6 + -0x30;
    } while (lVar6 != -0x28);
    goto LAB_00196fc1;
  case kCooperativeMatrixKHR:
    iVar3 = (*type->_vptr_Type[0x38])(type);
    lVar6 = CONCAT44(extraout_var_06,iVar3);
    uVar2 = GetTypeInstruction(this,*(Type **)(lVar6 + 0x28));
    if (uVar2 == 0) {
      return 0;
    }
    local_1f8._vptr_SmallVector = (_func_int **)this->context_;
    local_288._M_head_impl = (Instruction *)((ulong)local_288._M_head_impl._4_4_ << 0x20);
    local_298._M_array = (iterator)CONCAT44(local_298._M_array._4_4_,0x1168);
    local_208 = (IRContext *)CONCAT44(local_208._4_4_,uVar2);
    init_list_06._M_len = 1;
    init_list_06._M_array = (iterator)&local_208;
    local_350 = type;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_310,init_list_06);
    fVar4 = 1.4013e-45;
    local_1b8._0_4_ = 1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&SStack_1b0,&local_310);
    local_314 = *(Op *)(lVar6 + 0x30);
    init_list_07._M_len = 1;
    init_list_07._M_array = &local_314;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&ops,init_list_07);
    local_188 = 5;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              (&local_180,(SmallVector<unsigned_int,_2UL> *)&ops);
    local_318 = *(uint *)(lVar6 + 0x34);
    init_list_08._M_len = 1;
    init_list_08._M_array = &local_318;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_2e8,init_list_08);
    local_158 = fVar4;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_150,&local_2e8);
    local_1fc = *(uint32_t *)(lVar6 + 0x38);
    init_list_09._M_len = 1;
    init_list_09._M_array = &local_1fc;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_2c0,init_list_09);
    local_128 = fVar4;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_120,&local_2c0);
    local_200 = *(uint *)(lVar6 + 0x3c);
    init_list_10._M_len = 1;
    init_list_10._M_array = &local_200;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_258,init_list_10);
    local_f8 = fVar4;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_f0,&local_258);
    local_280._vptr_SmallVector = (_func_int **)local_1b8;
    local_280.size_ = 5;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_230,(IRContext **)&local_1f8,(Op *)&local_298,(int *)&local_288,
               &local_35c,(initializer_list<spvtools::opt::Operand> *)&local_280);
    local_358._M_head_impl = (Instruction *)local_230._vptr_SmallVector;
    local_230._vptr_SmallVector = (_func_int **)0x0;
    lVar6 = 200;
    do {
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)((long)(SStack_1b0.buffer + -6) + lVar6));
      lVar6 = lVar6 + -0x30;
    } while (lVar6 != -0x28);
LAB_00196fb4:
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_258);
LAB_00196fc1:
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_2c0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_2e8);
LAB_00196fdb:
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)&ops);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_310);
    type = local_350;
    goto LAB_0019732a;
  case kRayQueryKHR:
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this->context_;
    local_2c0._vptr_SmallVector = (_func_int **)((ulong)local_2c0._vptr_SmallVector._4_4_ << 0x20);
    local_2e8._vptr_SmallVector = (_func_int **)CONCAT44(local_2e8._vptr_SmallVector._4_4_,0x1178);
    break;
  case kHitObjectNV:
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this->context_;
    local_2c0._vptr_SmallVector = (_func_int **)((ulong)local_2c0._vptr_SmallVector._4_4_ << 0x20);
    local_2e8._vptr_SmallVector = (_func_int **)CONCAT44(local_2e8._vptr_SmallVector._4_4_,0x14a1);
    break;
  default:
    __assert_fail("false && \"Unexpected type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/type_manager.cpp"
                  ,0x1bd,
                  "uint32_t spvtools::opt::analysis::TypeManager::GetTypeInstruction(const Type *)")
    ;
  }
  local_1b8 = (undefined1  [8])0x0;
  SStack_1b0._vptr_SmallVector = (_func_int **)0x0;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)&local_310,(IRContext **)&ops,(Op *)&local_2e8,(int *)&local_2c0,&local_35c
             ,(initializer_list<spvtools::opt::Operand> *)local_1b8);
  local_358._M_head_impl = (Instruction *)local_310._vptr_SmallVector;
LAB_0019732a:
  IRContext::AddType(this->context_,
                     (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      *)&local_358);
  IRContext::AnalyzeDefUse
            (this->context_,
             (((this->context_->module_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->types_values_).
             super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
  AttachDecorations(this,local_35c,type);
  uVar2 = local_35c;
  if ((IRContext *)local_358._M_head_impl != (IRContext *)0x0) {
    (*(code *)((spv_context)
              ((local_358._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
              _vptr_IntrusiveNodeBase)->opcode_table)();
  }
  return uVar2;
}

Assistant:

uint32_t TypeManager::GetTypeInstruction(const Type* type) {
  uint32_t id = GetId(type);
  if (id != 0) return id;

  std::unique_ptr<Instruction> typeInst;
  // TODO(1841): Handle id overflow.
  id = context()->TakeNextId();
  if (id == 0) {
    return 0;
  }

  RegisterType(id, *type);
  switch (type->kind()) {
#define DefineParameterlessCase(kind)                                         \
  case Type::k##kind:                                                         \
    typeInst = MakeUnique<Instruction>(context(), spv::Op::OpType##kind, 0,   \
                                       id, std::initializer_list<Operand>{}); \
    break
    DefineParameterlessCase(Void);
    DefineParameterlessCase(Bool);
    DefineParameterlessCase(Sampler);
    DefineParameterlessCase(Event);
    DefineParameterlessCase(DeviceEvent);
    DefineParameterlessCase(ReserveId);
    DefineParameterlessCase(Queue);
    DefineParameterlessCase(PipeStorage);
    DefineParameterlessCase(NamedBarrier);
    DefineParameterlessCase(AccelerationStructureNV);
    DefineParameterlessCase(RayQueryKHR);
    DefineParameterlessCase(HitObjectNV);
#undef DefineParameterlessCase
    case Type::kInteger:
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeInt, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_LITERAL_INTEGER, {type->AsInteger()->width()}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER,
               {(type->AsInteger()->IsSigned() ? 1u : 0u)}}});
      break;
    case Type::kFloat:
      // TODO: Handle FP encoding enums once actually used.
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeFloat, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_LITERAL_INTEGER, {type->AsFloat()->width()}}});
      break;
    case Type::kVector: {
      uint32_t subtype = GetTypeInstruction(type->AsVector()->element_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst =
          MakeUnique<Instruction>(context(), spv::Op::OpTypeVector, 0, id,
                                  std::initializer_list<Operand>{
                                      {SPV_OPERAND_TYPE_ID, {subtype}},
                                      {SPV_OPERAND_TYPE_LITERAL_INTEGER,
                                       {type->AsVector()->element_count()}}});
      break;
    }
    case Type::kMatrix: {
      uint32_t subtype = GetTypeInstruction(type->AsMatrix()->element_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst =
          MakeUnique<Instruction>(context(), spv::Op::OpTypeMatrix, 0, id,
                                  std::initializer_list<Operand>{
                                      {SPV_OPERAND_TYPE_ID, {subtype}},
                                      {SPV_OPERAND_TYPE_LITERAL_INTEGER,
                                       {type->AsMatrix()->element_count()}}});
      break;
    }
    case Type::kImage: {
      const Image* image = type->AsImage();
      uint32_t subtype = GetTypeInstruction(image->sampled_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeImage, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {subtype}},
              {SPV_OPERAND_TYPE_DIMENSIONALITY,
               {static_cast<uint32_t>(image->dim())}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER, {image->depth()}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER,
               {(image->is_arrayed() ? 1u : 0u)}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER,
               {(image->is_multisampled() ? 1u : 0u)}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER, {image->sampled()}},
              {SPV_OPERAND_TYPE_SAMPLER_IMAGE_FORMAT,
               {static_cast<uint32_t>(image->format())}},
              {SPV_OPERAND_TYPE_ACCESS_QUALIFIER,
               {static_cast<uint32_t>(image->access_qualifier())}}});
      break;
    }
    case Type::kSampledImage: {
      uint32_t subtype =
          GetTypeInstruction(type->AsSampledImage()->image_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeSampledImage, 0, id,
          std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {subtype}}});
      break;
    }
    case Type::kArray: {
      uint32_t subtype = GetTypeInstruction(type->AsArray()->element_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeArray, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {subtype}},
              {SPV_OPERAND_TYPE_ID, {type->AsArray()->LengthId()}}});
      break;
    }
    case Type::kRuntimeArray: {
      uint32_t subtype =
          GetTypeInstruction(type->AsRuntimeArray()->element_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeRuntimeArray, 0, id,
          std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {subtype}}});
      break;
    }
    case Type::kStruct: {
      std::vector<Operand> ops;
      const Struct* structTy = type->AsStruct();
      for (auto ty : structTy->element_types()) {
        uint32_t member_type_id = GetTypeInstruction(ty);
        if (member_type_id == 0) {
          return 0;
        }
        ops.push_back(Operand(SPV_OPERAND_TYPE_ID, {member_type_id}));
      }
      typeInst =
          MakeUnique<Instruction>(context(), spv::Op::OpTypeStruct, 0, id, ops);
      break;
    }
    case Type::kOpaque: {
      const Opaque* opaque = type->AsOpaque();
      // Convert to null-terminated packed UTF-8 string.
      std::vector<uint32_t> words = spvtools::utils::MakeVector(opaque->name());
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeOpaque, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_LITERAL_STRING, words}});
      break;
    }
    case Type::kPointer: {
      const Pointer* pointer = type->AsPointer();
      uint32_t subtype = GetTypeInstruction(pointer->pointee_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypePointer, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_STORAGE_CLASS,
               {static_cast<uint32_t>(pointer->storage_class())}},
              {SPV_OPERAND_TYPE_ID, {subtype}}});
      break;
    }
    case Type::kFunction: {
      std::vector<Operand> ops;
      const Function* function = type->AsFunction();
      uint32_t return_type_id = GetTypeInstruction(function->return_type());
      if (return_type_id == 0) {
        return 0;
      }
      ops.push_back(Operand(SPV_OPERAND_TYPE_ID, {return_type_id}));
      for (auto ty : function->param_types()) {
        uint32_t paramater_type_id = GetTypeInstruction(ty);
        if (paramater_type_id == 0) {
          return 0;
        }
        ops.push_back(Operand(SPV_OPERAND_TYPE_ID, {paramater_type_id}));
      }
      typeInst = MakeUnique<Instruction>(context(), spv::Op::OpTypeFunction, 0,
                                         id, ops);
      break;
    }
    case Type::kPipe:
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypePipe, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ACCESS_QUALIFIER,
               {static_cast<uint32_t>(type->AsPipe()->access_qualifier())}}});
      break;
    case Type::kForwardPointer:
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeForwardPointer, 0, 0,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {type->AsForwardPointer()->target_id()}},
              {SPV_OPERAND_TYPE_STORAGE_CLASS,
               {static_cast<uint32_t>(
                   type->AsForwardPointer()->storage_class())}}});
      break;
    case Type::kCooperativeMatrixNV: {
      auto coop_mat = type->AsCooperativeMatrixNV();
      uint32_t const component_type =
          GetTypeInstruction(coop_mat->component_type());
      if (component_type == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeCooperativeMatrixNV, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {component_type}},
              {SPV_OPERAND_TYPE_SCOPE_ID, {coop_mat->scope_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->rows_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->columns_id()}}});
      break;
    }
    case Type::kCooperativeMatrixKHR: {
      auto coop_mat = type->AsCooperativeMatrixKHR();
      uint32_t const component_type =
          GetTypeInstruction(coop_mat->component_type());
      if (component_type == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeCooperativeMatrixKHR, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {component_type}},
              {SPV_OPERAND_TYPE_SCOPE_ID, {coop_mat->scope_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->rows_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->columns_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->use_id()}}});
      break;
    }
    default:
      assert(false && "Unexpected type");
      break;
  }
  context()->AddType(std::move(typeInst));
  context()->AnalyzeDefUse(&*--context()->types_values_end());
  AttachDecorations(id, type);
  return id;
}